

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::check_active_high(Generator *top)

{
  undefined1 local_c8 [8];
  ActiveVisitor visitor;
  Generator *top_local;
  
  visitor.reset_stmt_._M_h._M_single_bucket = (__node_base_ptr)top;
  ActiveVisitor::ActiveVisitor((ActiveVisitor *)local_c8);
  IRVisitor::visit_root_s((IRVisitor *)local_c8,(IRNode *)visitor.reset_stmt_._M_h._M_single_bucket)
  ;
  ActiveVisitor::~ActiveVisitor((ActiveVisitor *)local_c8);
  return;
}

Assistant:

void check_active_high(Generator* top) {
    ActiveVisitor visitor;
    visitor.visit_root_s(top);
}